

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::RefCountedObject<Diligent::IRenderDeviceGL>::~RefCountedObject
          (RefCountedObject<Diligent::IRenderDeviceGL> *this)

{
  code *pcVar1;
  RefCountedObject<Diligent::IRenderDeviceGL> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~RefCountedObject()
    {
        // WARNING! m_pRefCounters may be expired in scenarios like this:
        //
        //    A ==sp==> B ---wp---> A
        //
        //    RefCounters_A.ReleaseStrongRef(){ // NumStrongRef == 0, NumWeakRef == 1
        //      bDestroyThis = (m_NumWeakReferences == 0) == false;
        //      delete A{
        //        A.~dtor(){
        //            B.~dtor(){
        //                wpA.ReleaseWeakRef(){ // NumStrongRef == 0, NumWeakRef == 0, m_pObject==nullptr
        //                    delete RefCounters_A;
        //        ...
        //        VERIFY( m_pRefCounters->GetNumStrongRefs() == 0 // Access violation!

        // This also may happen if one thread is executing ReleaseStrongRef(), while
        // another one is simultaneously running ReleaseWeakRef().

        //VERIFY( m_pRefCounters->GetNumStrongRefs() == 0,
        //        "There remain strong references to the object being destroyed" );
    }